

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

bool Shell::FunctionDefinition::occurs(uint f,Term *t)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  TermFunIterator funs;
  TermFunIterator local_50;
  
  Kernel::TermFunIterator::TermFunIterator(&local_50,t);
  do {
    bVar1 = Kernel::TermFunIterator::hasNext(&local_50);
    if (!bVar1) break;
    uVar2 = Kernel::TermFunIterator::next(&local_50);
  } while (uVar2 != f);
  local_50.super_IteratorCore<unsigned_int>._vptr_IteratorCore =
       (_func_int **)&PTR__TermFunIterator_00b69738;
  if (local_50._stack._stack != (TermList **)0x0) {
    uVar3 = local_50._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._stack._stack;
    }
    else if (uVar3 < 0x11) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._stack._stack;
    }
    else if (uVar3 < 0x19) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._stack._stack;
    }
    else if (uVar3 < 0x21) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._stack._stack;
    }
    else if (uVar3 < 0x31) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._stack._stack;
    }
    else if (uVar3 < 0x41) {
      *local_50._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._stack._stack;
    }
    else {
      operator_delete(local_50._stack._stack,0x10);
    }
  }
  return bVar1;
}

Assistant:

bool FunctionDefinition::occurs (unsigned f, Term& t)
{
  TermFunIterator funs(&t);
  while (funs.hasNext()) {
    if (f == funs.next()) {
      return true;
    }
  }
  return false;
}